

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::Image(RenderTexture *texture,Vector2f *size,Color *tintColor,Color *borderColor)

{
  uint glTextureHandle;
  Texture *this;
  ImTextureID user_texture_id;
  ImVec4 local_8c;
  ImVec4 local_7c;
  Color local_6c;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImTextureID local_30;
  ImTextureID textureID;
  Color *borderColor_local;
  Color *tintColor_local;
  Vector2f *size_local;
  RenderTexture *texture_local;
  
  textureID = borderColor;
  borderColor_local = tintColor;
  tintColor_local = (Color *)size;
  size_local = (Vector2f *)texture;
  this = sf::RenderTexture::getTexture(texture);
  glTextureHandle = sf::Texture::getNativeHandle(this);
  user_texture_id = anon_unknown.dwarf_f6bf2::convertGLTextureHandleToImTextureID(glTextureHandle);
  local_30 = user_texture_id;
  ImVec2::ImVec2(&local_38,(float)*tintColor_local,(float)tintColor_local[1]);
  ImVec2::ImVec2(&local_40,0.0,1.0);
  ImVec2::ImVec2(&local_48,1.0,0.0);
  local_6c = *borderColor_local;
  local_68 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(local_6c);
  local_58 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_68);
  local_8c = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*textureID);
  local_7c = ImColor::operator_cast_to_ImVec4((ImColor *)&local_8c);
  Image(user_texture_id,&local_38,&local_40,&local_48,&local_58,&local_7c);
  return;
}

Assistant:

void Image(const sf::RenderTexture& texture, const sf::Vector2f& size, const sf::Color& tintColor,
           const sf::Color& borderColor) {
    ImTextureID textureID =
        convertGLTextureHandleToImTextureID(texture.getTexture().getNativeHandle());

    ImGui::Image(textureID, ImVec2(size.x, size.y), ImVec2(0, 1),
                 ImVec2(1, 0), // flipped vertically, because textures in sf::RenderTexture are
                               // stored this way
                 toImColor(tintColor), toImColor(borderColor));
}